

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cxx
# Opt level: O1

char * unique_id(void *o,char *type,char *name,char *label)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  id *piVar5;
  byte *pbVar6;
  id **ppiVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  byte *__s;
  char buffer [128];
  char *local_c0;
  char local_b8 [136];
  
  cVar2 = *type;
  if (cVar2 == '\0') {
    pcVar10 = local_b8;
  }
  else {
    pcVar9 = type + 1;
    pcVar10 = local_b8;
    do {
      *pcVar10 = cVar2;
      pcVar10 = pcVar10 + 1;
      cVar2 = *pcVar9;
      pcVar9 = pcVar9 + 1;
    } while (cVar2 != '\0');
  }
  *pcVar10 = '_';
  if ((name == (char *)0x0) || (*name == '\0')) {
    name = label;
  }
  __s = (byte *)(pcVar10 + 1);
  if (((byte *)name != (byte *)0x0) && (*name != 0)) {
    bVar3 = *name;
    while ((((bVar3 != 0 && (bVar3 != 0x5f)) && ((byte)(bVar3 - 0x3a) < 0xf6)) &&
           ((byte)((bVar3 & 0xdf) + 0xa5) < 0xe6))) {
      pbVar6 = (byte *)name + 1;
      name = (char *)((byte *)name + 1);
      bVar3 = *pbVar6;
    }
    bVar3 = *name;
    if (((bVar3 == 0x5f) || (0xf5 < (byte)(bVar3 - 0x3a))) || (0xe5 < (byte)((bVar3 & 0xdf) + 0xa5))
       ) {
      pbVar6 = (byte *)name + 1;
      do {
        do {
          *__s = bVar3;
          __s = __s + 1;
          bVar3 = *pbVar6;
          pbVar6 = pbVar6 + 1;
        } while (bVar3 == 0x5f);
      } while ((0xf5 < (byte)(bVar3 - 0x3a)) || (0xe5 < (byte)((bVar3 & 0xdf) + 0xa5)));
    }
  }
  *__s = 0;
  ppiVar7 = &id_root;
  if (id_root != (id *)0x0) {
    uVar8 = 0;
    piVar5 = id_root;
    do {
      pcVar10 = piVar5->text;
      uVar4 = strcmp(local_b8,pcVar10);
      if (uVar4 == 0) {
        if (piVar5->object == o) {
          bVar1 = true;
          local_c0 = pcVar10;
        }
        else {
          uVar8 = uVar8 + 1;
          sprintf((char *)__s,"%x",(ulong)uVar8);
          bVar1 = false;
          ppiVar7 = &id_root;
        }
      }
      else {
        ppiVar7 = &piVar5->left + (~uVar4 >> 0x1f);
        bVar1 = false;
      }
      if (bVar1) {
        return local_c0;
      }
      piVar5 = *ppiVar7;
    } while (piVar5 != (id *)0x0);
  }
  piVar5 = (id *)operator_new(0x20);
  pcVar10 = strdup(local_b8);
  piVar5->text = pcVar10;
  piVar5->object = o;
  piVar5->left = (id *)0x0;
  piVar5->right = (id *)0x0;
  *ppiVar7 = piVar5;
  return piVar5->text;
}

Assistant:

const char* unique_id(void* o, const char* type, const char* name, const char* label) {
  char buffer[128];
  char* q = buffer;
  while (*type) *q++ = *type++;
  *q++ = '_';
  const char* n = name;
  if (!n || !*n) n = label;
  if (n && *n) {
    while (*n && !is_id(*n)) n++;
    while (is_id(*n)) *q++ = *n++;
  }
  *q = 0;
  // okay, search the tree and see if the name was already used:
  id** p = &id_root;
  int which = 0;
  while (*p) {
    int i = strcmp(buffer, (*p)->text);
    if (!i) {
      if ((*p)->object == o) return (*p)->text;
      // already used, we need to pick a new name:
      sprintf(q,"%x",++which);
      p = &id_root;
      continue;
    }
    else if (i < 0) p = &((*p)->left);
    else p  = &((*p)->right);
  }
  *p = new id(buffer, o);
  return (*p)->text;
}